

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMTypeRef CompileLlvmFunctionType(LlvmCompilationContext *ctx,TypeFunction *functionType)

{
  TypeBase *returnType;
  LLVMTypeRef pLVar1;
  ArrayView<TypeBase_*> argumentTypes_00;
  ArrayView<TypeBase*> local_158 [32];
  TypeBase *local_138;
  TypeHandle *curr;
  SmallArray<TypeBase_*,_32U> argumentTypes;
  TypeFunction *functionType_local;
  LlvmCompilationContext *ctx_local;
  
  argumentTypes.allocator = (Allocator *)functionType;
  SmallArray<TypeBase_*,_32U>::SmallArray((SmallArray<TypeBase_*,_32U> *)&curr,ctx->allocator);
  for (local_138 = (TypeBase *)argumentTypes.allocator[0xd]._vptr_Allocator;
      local_138 != (TypeBase *)0x0; local_138 = *(TypeBase **)((long)local_138 + 8)) {
    SmallArray<TypeBase_*,_32U>::push_back
              ((SmallArray<TypeBase_*,_32U> *)&curr,(TypeBase **)local_138);
  }
  SmallArray<TypeBase_*,_32U>::push_back
            ((SmallArray<TypeBase_*,_32U> *)&curr,&ctx->ctx->typeNullPtr);
  returnType = (TypeBase *)argumentTypes.allocator[0xc]._vptr_Allocator;
  ArrayView<TypeBase*>::ArrayView<32u>(local_158,(SmallArray<TypeBase_*,_32U> *)&curr);
  argumentTypes_00._12_4_ = 0;
  argumentTypes_00._0_12_ = local_158._0_12_;
  pLVar1 = CompileLlvmFunctionType(ctx,returnType,argumentTypes_00);
  SmallArray<TypeBase_*,_32U>::~SmallArray((SmallArray<TypeBase_*,_32U> *)&curr);
  return pLVar1;
}

Assistant:

LLVMTypeRef CompileLlvmFunctionType(LlvmCompilationContext &ctx, TypeFunction *functionType)
{
	SmallArray<TypeBase*, 32> argumentTypes(ctx.allocator);

	for(TypeHandle *curr = functionType->arguments.head; curr; curr = curr->next)
		argumentTypes.push_back(curr->type);

	argumentTypes.push_back(ctx.ctx.typeNullPtr);

	return CompileLlvmFunctionType(ctx, functionType->returnType, argumentTypes);
}